

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestFactory<gurkenlaeufer::detail::CucumberTest_runStepsInScenario_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<gurkenlaeufer::detail::CucumberTest_runStepsInScenario_Test>
           *this)

{
  ParameterizedTestFactory<gurkenlaeufer::detail::CucumberTest_runStepsInScenario_Test> *this_local;
  
  ~ParameterizedTestFactory(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}